

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O0

void csp_iflist_add(csp_iface_t *ifc)

{
  csp_iface_t *pcVar1;
  int iVar2;
  csp_iface_t *in_RDI;
  csp_iface_t *i;
  csp_iface_t *last;
  csp_iface_t *local_18;
  csp_iface_t *local_10;
  
  pcVar1 = interfaces;
  if (((in_RDI != (csp_iface_t *)0x0) && (in_RDI->name != (char *)0x0)) &&
     (in_RDI->next = (csp_iface_s *)0x0, pcVar1 = in_RDI, interfaces != (csp_iface_t *)0x0)) {
    local_10 = (csp_iface_t *)0x0;
    for (local_18 = interfaces; local_18 != (csp_iface_t *)0x0; local_18 = local_18->next) {
      if (local_18 == in_RDI) {
        return;
      }
      iVar2 = strncmp(in_RDI->name,local_18->name,10);
      if (iVar2 == 0) {
        return;
      }
      local_10 = local_18;
    }
    local_10->next = in_RDI;
    pcVar1 = interfaces;
  }
  interfaces = pcVar1;
  return;
}

Assistant:

void csp_iflist_add(csp_iface_t * ifc) {

	if ((ifc == NULL) || (ifc->name == NULL)) {
		return;
	}

	ifc->next = NULL;

	/* Add interface to pool */
	if (interfaces == NULL) {
		/* This is the first interface to be added */
		interfaces = ifc;
	} else {
		/* Insert interface last if not already in pool */
		csp_iface_t * last = NULL;
		for (csp_iface_t * i = interfaces; i != NULL; i = i->next) {
			if ((i == ifc) || (strncmp(ifc->name, i->name, CSP_IFLIST_NAME_MAX) == 0)) {
				return;
			}
			last = i;
		}

		last->next = ifc;
	}

}